

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O0

_Bool parse_paint(element_t *element,int id,paint_t *paint)

{
  char *pcVar1;
  _Bool _Var2;
  char *end_00;
  bool bVar3;
  byte local_4b;
  char *begin;
  char *end;
  char *it;
  string_t *value;
  paint_t *paint_local;
  element_t *peStack_18;
  int id_local;
  element_t *element_local;
  
  value = (string_t *)paint;
  paint_local._4_4_ = id;
  peStack_18 = element;
  it = (char *)find_attribute(element,id,true);
  if ((string_t *)it == (string_t *)0x0) {
    element_local._7_1_ = false;
  }
  else {
    end = ((string_t *)it)->data;
    end_00 = end + ((string_t *)it)->length;
    _Var2 = skip_string(&end,end_00,"none");
    if (_Var2) {
      *(undefined4 *)&value->data = 0;
      _Var2 = skip_ws(&end,end_00);
      element_local._7_1_ = (_Bool)((_Var2 ^ 0xffU) & 1);
    }
    else {
      _Var2 = parse_url_value(&end,end_00,value + 1);
      if (_Var2) {
        *(undefined4 *)&value->data = 2;
        *(undefined4 *)&value->length = 0;
        _Var2 = skip_ws(&end,end_00);
        if ((!_Var2) ||
           (_Var2 = parse_color_value(&end,end_00,(color_t *)((long)&value->data + 4)), _Var2)) {
          element_local._7_1_ = end == end_00;
        }
        else {
          element_local._7_1_ = false;
        }
      }
      else {
        _Var2 = skip_string(&end,end_00,"var");
        if (_Var2) {
          _Var2 = skip_ws(&end,end_00);
          if (((_Var2) && (_Var2 = skip_delim(&end,end_00,'('), _Var2)) &&
             (_Var2 = skip_ws(&end,end_00), _Var2)) {
            _Var2 = skip_string(&end,end_00,"--");
            pcVar1 = end;
            if (_Var2) {
              while( true ) {
                bVar3 = false;
                if ((((end < end_00) && ((*end < 'a' || (bVar3 = true, 'z' < *end)))) &&
                    ((*end < 'A' || (bVar3 = true, 'Z' < *end)))) &&
                   ((((bVar3 = true, *end != '_' && (bVar3 = true, *end != ':')) &&
                     ((*end < '0' || (bVar3 = true, '9' < *end)))) && (bVar3 = true, *end != '-'))))
                {
                  bVar3 = *end == '.';
                }
                if (!bVar3) break;
                end = end + 1;
              }
              *(undefined4 *)&value->data = 3;
              value[1].data = pcVar1;
              value[1].length = (long)end - (long)pcVar1;
              *(undefined4 *)&value->length = 0;
              skip_ws(&end,end_00);
              _Var2 = skip_delim(&end,end_00,',');
              if (_Var2) {
                skip_ws(&end,end_00);
                _Var2 = parse_color_value(&end,end_00,(color_t *)((long)&value->data + 4));
                if (!_Var2) {
                  return false;
                }
              }
              _Var2 = skip_delim(&end,end_00,')');
              local_4b = 0;
              if (_Var2) {
                _Var2 = skip_ws(&end,end_00);
                local_4b = _Var2 ^ 0xff;
              }
              element_local._7_1_ = (_Bool)(local_4b & 1);
            }
            else {
              element_local._7_1_ = false;
            }
          }
          else {
            element_local._7_1_ = false;
          }
        }
        else {
          _Var2 = parse_color_value(&end,end_00,(color_t *)((long)&value->data + 4));
          if (_Var2) {
            *(undefined4 *)&value->data = 1;
            element_local._7_1_ = end == end_00;
          }
          else {
            element_local._7_1_ = false;
          }
        }
      }
    }
  }
  return element_local._7_1_;
}

Assistant:

static bool parse_paint(const element_t* element, int id, paint_t* paint)
{
    const string_t* value = find_attribute(element, id, true);
    if(value == NULL)
        return false;
    const char* it = value->data;
    const char* end = it + value->length;
    if(skip_string(&it, end, "none")) {
        paint->type = paint_type_none;
        return !skip_ws(&it, end);
    }

    if(parse_url_value(&it, end, &paint->id)) {
        paint->type = paint_type_url;
        paint->color.value = 0x00000000;
        if(skip_ws(&it, end)) {
            if(!parse_color_value(&it, end, &paint->color)) {
                return false;
            }
        }

        return it == end;
    }

    if(skip_string(&it, end, "var")) {
        if(!skip_ws(&it, end)
            || !skip_delim(&it, end, '(')
            || !skip_ws(&it, end)) {
            return false;
        }

        if(!skip_string(&it, end, "--"))
            return false;
        const char* begin = it;
        while(it < end && IS_NAMECHAR(*it))
            ++it;
        paint->type = paint_type_var;
        paint->id.data = begin;
        paint->id.length = it - begin;
        paint->color.value = 0x00000000;
        skip_ws(&it, end);
        if(skip_delim(&it, end, ',')) {
            skip_ws(&it, end);
            if(!parse_color_value(&it, end, &paint->color)) {
                return false;
            }
        }

        return skip_delim(&it, end, ')') && !skip_ws(&it, end);
    }

    if(parse_color_value(&it, end, &paint->color)) {
        paint->type = paint_type_color;
        return it == end;
    }

    return false;
}